

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NUMAMemoryPool.cpp
# Opt level: O2

IMemoryPool * __thiscall xmrig::NUMAMemoryPool::getOrCreate(NUMAMemoryPool *this,uint32_t node)

{
  MemoryPool *this_00;
  pair<const_unsigned_int,_xmrig::IMemoryPool_*> local_28;
  
  this_00 = (MemoryPool *)get(this,node);
  if (this_00 == (MemoryPool *)0x0) {
    this_00 = (MemoryPool *)operator_new(0x20);
    MemoryPool::MemoryPool(this_00,this->m_nodeSize,this->m_hugePages,node);
    local_28.first = node;
    local_28.second = (IMemoryPool *)this_00;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,xmrig::IMemoryPool*>,std::_Select1st<std::pair<unsigned_int_const,xmrig::IMemoryPool*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,xmrig::IMemoryPool*>>>
    ::_M_insert_unique<std::pair<unsigned_int_const,xmrig::IMemoryPool*>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,xmrig::IMemoryPool*>,std::_Select1st<std::pair<unsigned_int_const,xmrig::IMemoryPool*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,xmrig::IMemoryPool*>>>
                *)&this->m_map,&local_28);
  }
  return &this_00->super_IMemoryPool;
}

Assistant:

xmrig::IMemoryPool *xmrig::NUMAMemoryPool::getOrCreate(uint32_t node) const
{
    auto pool = get(node);
    if (!pool) {
        pool = new MemoryPool(m_nodeSize, m_hugePages, node);
        m_map.insert({ node, pool });
    }

    return pool;
}